

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerFactory.cpp
# Opt level: O3

NamerCreator * ApprovalTests::DefaultNamerFactory::defaultNamer(void)

{
  if (defaultNamer()::namer == '\0') {
    defaultNamer();
  }
  return &defaultNamer::namer;
}

Assistant:

NamerCreator& DefaultNamerFactory::defaultNamer()
    {
        static NamerCreator namer = []() {
            return std::make_shared<ApprovalTestNamer>();
        };
        return namer;
    }